

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bet.cpp
# Opt level: O2

uint __thiscall Bet::selectBetWisePharaohs(Bet *this,uint *bet,double *credit)

{
  double *credits;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  CreditField repeatInput;
  vector<unsigned_int,_std::allocator<unsigned_int>_> betVector;
  string y;
  uint FiveEuro;
  uint FourEuro;
  uint threeEuro;
  uint twoEuro;
  uint oneEuro;
  SelectGame selectgame;
  string confirm;
  string okay;
  
  betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  oneEuro = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&oneEuro);
  twoEuro = 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&twoEuro);
  threeEuro = 3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&threeEuro);
  FourEuro = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&FourEuro);
  FiveEuro = 5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&betVector,&FiveEuro);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&okay,"ok",(allocator<char> *)&selectgame);
  confirm._M_dataplus._M_p = (pointer)&confirm.field_2;
  confirm._M_string_length = 0;
  confirm.field_2._M_local_buf[0] = '\0';
  y._M_dataplus._M_p = (pointer)&y.field_2;
  y._M_string_length = 0;
  y.field_2._M_local_buf[0] = '\0';
  CreditField::CreditField(&repeatInput);
  credits = &this->_credit_bet;
  while (*credits <= 1.0 && *credits != 1.0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Please insert Credit! The minimum is 1 Euro! ");
    std::endl<char,std::char_traits<char>>(poVar3);
    CreditField::AddCredit(&repeatInput,credits);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,">>>The minimum bet is: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Euro and the max bet is: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Euro! ");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,">>>Current Bet: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Euro");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (1.0 <= *credits) {
    poVar3 = std::operator<<((ostream *)&std::cout,">>>Please, Select Bet! ");
    std::endl<char,std::char_traits<char>>(poVar3);
    dVar9 = *credits;
    if (5.0 <= dVar9) {
      poVar3 = std::operator<<((ostream *)&std::cout,">>>Play On Max Bet!");
      std::endl<char,std::char_traits<char>>(poVar3);
      dVar9 = *credits;
    }
    if (dVar9 < 5.0) {
      poVar3 = std::operator<<((ostream *)&std::cout,">>>Insert credit to play on max bet! ");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = 0;
    iVar6 = 0;
LAB_001051a5:
    bVar1 = std::operator!=(&confirm,&okay);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press y to increase the bet! ");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press n to decrease the bet!");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press q to quit!");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press o to play with current bet!");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"---Press m for more games!");
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "********************************************************************************************************************"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      std::operator>>((istream *)&std::cin,(string *)&y);
      for (uVar8 = 0;
          uVar8 < (ulong)((long)betVector.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)betVector.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
        cVar4 = *y._M_dataplus._M_p;
        if (cVar4 == 'm') {
          cVar4 = 'm';
          if (y._M_string_length == 1) {
            SelectGame::SelectGame(&selectgame);
            SelectGame::selectGame_Welcome(&selectgame);
            SelectGame::selectGame_Games(&selectgame);
            SelectGame::selectGame_Option(&selectgame,credit);
            SelectGame::~SelectGame(&selectgame);
            cVar4 = *y._M_dataplus._M_p;
          }
        }
        else if (cVar4 == 'n') {
          cVar4 = 'n';
          if (y._M_string_length == 1) {
            if (betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] < 2) {
              betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = 1;
              *bet = 1;
              iVar7 = iVar6 + 1;
              if (-1 < iVar6) {
                poVar3 = std::operator<<((ostream *)&std::cout,
                                         "You are already playing on minimum bet!");
                std::endl<char,std::char_traits<char>>(poVar3);
              }
            }
            else {
              uVar5 = betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar8] - 1;
              betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = uVar5;
              *bet = uVar5;
              iVar7 = 0;
            }
            poVar3 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3," Euro");
            std::endl<char,std::char_traits<char>>(poVar3);
            iVar6 = iVar7;
            break;
          }
        }
        else if (cVar4 == 'q') {
          cVar4 = 'q';
          if (y._M_string_length == 1) {
            poVar3 = std::operator<<((ostream *)&std::cout,"Cashout...");
            std::endl<char,std::char_traits<char>>(poVar3);
            std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
            poVar3 = std::ostream::_M_insert<double>(*credits);
            poVar3 = std::operator<<(poVar3," Euro!");
            std::endl<char,std::char_traits<char>>(poVar3);
            SelectGame::SelectGame(&selectgame);
            SelectGame::selectGame_Welcome(&selectgame);
            SelectGame::selectGame_Games(&selectgame);
            *credit = 0.0;
            SelectGame::selectGame_Option(&selectgame,credit);
            SelectGame::~SelectGame(&selectgame);
            break;
          }
        }
        else if ((cVar4 == 'y') && (cVar4 = 'y', y._M_string_length == 1)) {
          dVar9 = *credits;
          if ((double)*bet < dVar9) {
            if (betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] < 5) {
              if ((*credit == 1.0) && (!NAN(*credit))) {
                *bet = 1;
              }
              uVar5 = 1;
              if ((dVar9 != 1.0) || (NAN(dVar9))) {
                uVar5 = betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar8] + 1;
                betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8] = uVar5;
              }
              *bet = uVar5;
              iVar6 = 0;
            }
            else {
              betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = 5;
              *bet = 5;
              iVar2 = iVar2 + 1;
            }
            if (0 < iVar2) {
              poVar3 = std::operator<<((ostream *)&std::cout,"You are already playing on max bet!");
              std::endl<char,std::char_traits<char>>(poVar3);
            }
            poVar3 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
            poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            poVar3 = std::operator<<(poVar3," Euro");
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          else {
            if (((*bet != 5) || (*credit != 5.0)) || (NAN(*credit))) {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "Not enough credits to increase the bet!");
              std::endl<char,std::char_traits<char>>(poVar3);
              std::operator<<((ostream *)&std::cout,"Credits: ");
              poVar3 = std::ostream::_M_insert<double>(*credits);
              std::endl<char,std::char_traits<char>>(poVar3);
              poVar3 = std::operator<<((ostream *)&std::cout,"Bet: ");
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,"You are already playing on max bet!");
              std::endl<char,std::char_traits<char>>(poVar3);
              poVar3 = std::operator<<((ostream *)&std::cout,"Your Current bet is: ");
              poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
              poVar3 = std::operator<<(poVar3," Euro");
            }
            std::endl<char,std::char_traits<char>>(poVar3);
          }
          break;
        }
        if ((cVar4 == 'o') && (y._M_string_length == 1)) {
          *bet = betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
          Start::Start((Start *)&selectgame);
          Start::StartGameNowWisePharaohs5((Start *)&selectgame,credits,bet);
          std::__cxx11::string::assign((char *)&confirm);
          Start::~Start((Start *)&selectgame);
          break;
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"Invalid Input");
        std::endl<char,std::char_traits<char>>(poVar3);
        *bet = 1;
        std::operator>>((istream *)&std::cin,(string *)&y);
      }
      goto LAB_001051a5;
    }
  }
  uVar5 = *bet;
  CreditField::~CreditField(&repeatInput);
  std::__cxx11::string::~string((string *)&y);
  std::__cxx11::string::~string((string *)&confirm);
  std::__cxx11::string::~string((string *)&okay);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&betVector.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return uVar5;
}

Assistant:

unsigned int Bet::selectBetWisePharaohs(unsigned int& bet, double& credit) {

	std::vector<unsigned int> betVector;
	unsigned const int oneEuro = 1;
	betVector.push_back(oneEuro);
	unsigned const int twoEuro = 2;
	betVector.push_back(twoEuro);
	unsigned const int threeEuro = 3;
	betVector.push_back(threeEuro);
	unsigned const int FourEuro = 4;
	betVector.push_back(FourEuro);
	unsigned const int FiveEuro = 5;
	betVector.push_back(FiveEuro);

	std::string okay = "ok";
	std::string confirm;
	std::string y;
	int countAbove = 0;
	int countBelow = 0;

	//if credit < 1
	//if credit < 5
	//if credit< cannot increase!
	CreditField repeatInput;

	while (_credit_bet < oneEuro) {

		std::cout << "Please insert Credit! The minimum is 1 Euro! " << std::endl;
		repeatInput.AddCredit(_credit_bet);

	}
	std::cout << ">>>The minimum bet is: " << oneEuro << " Euro and the max bet is: " << FiveEuro << " Euro! " << std::endl;
	std::cout << ">>>Current Bet: " << betVector[0] << " Euro" << std::endl;
	if (_credit_bet >= oneEuro) {
		std::cout << ">>>Please, Select Bet! " << std::endl;
		if (_credit_bet >= FiveEuro) {
			std::cout << ">>>Play On Max Bet!" << std::endl;
		}
		if (_credit_bet < FiveEuro) {
			std::cout << ">>>Insert credit to play on max bet! " << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		while (confirm != okay) {
			std::cout << "---Press y to increase the bet! " << std::endl;
			std::cout << "---Press n to decrease the bet!" << std::endl;
			std::cout << "---Press q to quit!" << std::endl;
			std::cout << "---Press o to play with current bet!" << std::endl;
			std::cout << "---Press m for more games!" << std::endl;
			std::cout << "********************************************************************************************************************" << std::endl;
			std::cin >> y;
			//new code here for safety
			/*while (y.size() > 1) {

				std::cin >> y;
			}*/
			for (int i = 0; i < betVector.size(); i++) {
				if (y[0] == 'y' && y.size() == 1) {
					if (_credit_bet <= bet) {
						if (credit == FiveEuro && bet == FiveEuro) {
							std::cout << "You are already playing on max bet!" << std::endl;
							std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
							break;
						}
						else {
							std::cout << "Not enough credits to increase the bet!" << std::endl;
							std::cout << "Credits: " << _credit_bet << std::endl;
							std::cout << "Bet: " << bet << std::endl;

							break;
						}

					}
					else {

						if (betVector[i] >= FiveEuro) {
							betVector[i] = FiveEuro;
							bet = betVector[i];
							countAbove++;
						}
						else {
							if (credit == oneEuro) {
								bet = oneEuro;
							}
							if (_credit_bet == oneEuro) {
								bet = oneEuro;
							}
							else {

								betVector[i] += oneEuro;
								bet = betVector[i];
							}

							countBelow = 0;
						}
						if (countAbove > 0) {
							std::cout << "You are already playing on max bet!" << std::endl;
						}
						std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
						break;
					}

				}
				if (y[0] == 'n' && y.size() == 1) {

					if (betVector[i] <= oneEuro) {
						betVector[i] = oneEuro;
						bet = betVector[i];
						countBelow++;
					}
					else {
						betVector[i] -= 1;
						bet = betVector[i];
						countBelow = 0;
					}
					if (countBelow > 0) {
						std::cout << "You are already playing on minimum bet!" << std::endl;
					}
					std::cout << "Your Current bet is: " << bet << " Euro" << std::endl;
					break;
				}
				if (y[0] == 'q' && y.size() == 1) {
					std::cout << "Cashout..." << std::endl;
					std::cout << "Handpay! Call Attendant! " << _credit_bet << " Euro!" << std::endl;
					
					//std::chrono::seconds duration(3);
					//std::this_thread::sleep_for(duration);
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();
					credit = 0;
					//choosing a game
					selectgame.selectGame_Option(credit);
					//exit(0);
					break;
				}
				if (y[0] == 'm' && y.size() == 1) {
					SelectGame selectgame;
					selectgame.selectGame_Welcome();
					selectgame.selectGame_Games();

					//choosing a game
					selectgame.selectGame_Option(credit);
				}

				if (y[0] == 'o' && y.size() == 1) {
					bet = betVector[i];
					Start startgame;
					startgame.StartGameNowWisePharaohs5(_credit_bet, bet);
					confirm = "ok";
					break;
				}
				else {
					std::cout << "Invalid Input" << std::endl;
					bet = oneEuro;
					std::cin >> y;
				}
			}
		}
	}
	return bet;
}